

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O3

void iadst8x8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  __m256i alVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  
  lVar13 = (long)bit * 0x100;
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar13 + 0x220);
  iVar15 = 1 << ((char)bit - 1U & 0x1f);
  iVar16 = -iVar11;
  iVar14 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar12 = 0x8000;
  if (0xf < iVar14) {
    iVar12 = 1 << ((char)iVar14 - 1U & 0x1f);
  }
  iVar14 = -iVar12;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x170);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x250);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1b0);
  auVar32._4_4_ = uVar1;
  auVar32._0_4_ = uVar1;
  auVar32._8_4_ = uVar1;
  auVar32._12_4_ = uVar1;
  auVar32._16_4_ = uVar1;
  auVar32._20_4_ = uVar1;
  auVar32._24_4_ = uVar1;
  auVar32._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x210);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1f0);
  auVar20._4_4_ = uVar1;
  auVar20._0_4_ = uVar1;
  auVar20._8_4_ = uVar1;
  auVar20._12_4_ = uVar1;
  auVar20._16_4_ = uVar1;
  auVar20._20_4_ = uVar1;
  auVar20._24_4_ = uVar1;
  auVar20._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1d0);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x230);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 400);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1a0);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  iVar12 = iVar12 + -1;
  auVar25._4_4_ = iVar11;
  auVar25._0_4_ = iVar11;
  auVar25._8_4_ = iVar11;
  auVar25._12_4_ = iVar11;
  auVar25._16_4_ = iVar11;
  auVar25._20_4_ = iVar11;
  auVar25._24_4_ = iVar11;
  auVar25._28_4_ = iVar11;
  auVar18._4_4_ = iVar15;
  auVar18._0_4_ = iVar15;
  auVar18._8_4_ = iVar15;
  auVar18._12_4_ = iVar15;
  auVar18._16_4_ = iVar15;
  auVar18._20_4_ = iVar15;
  auVar18._24_4_ = iVar15;
  auVar18._28_4_ = iVar15;
  auVar3 = vpmulld_avx2((undefined1  [32])in[7],auVar28);
  auVar4 = vpmulld_avx2((undefined1  [32])*in,auVar30);
  auVar3 = vpaddd_avx2(auVar3,auVar18);
  auVar3 = vpaddd_avx2(auVar4,auVar3);
  auVar4 = vpmulld_avx2((undefined1  [32])in[7],auVar30);
  auVar28 = vpmulld_avx2(auVar28,(undefined1  [32])*in);
  auVar4 = vpaddd_avx2(auVar4,auVar18);
  auVar29 = vpsubd_avx2(auVar4,auVar28);
  auVar4 = vpmulld_avx2((undefined1  [32])in[5],auVar32);
  auVar28 = vpmulld_avx2((undefined1  [32])in[2],auVar34);
  auVar4 = vpaddd_avx2(auVar4,auVar18);
  auVar4 = vpaddd_avx2(auVar4,auVar28);
  auVar28 = vpmulld_avx2((undefined1  [32])in[5],auVar34);
  auVar30 = vpmulld_avx2(auVar32,(undefined1  [32])in[2]);
  auVar28 = vpaddd_avx2(auVar28,auVar18);
  auVar34 = vpsubd_avx2(auVar28,auVar30);
  auVar28 = vpmulld_avx2((undefined1  [32])in[3],auVar20);
  auVar30 = vpmulld_avx2((undefined1  [32])in[4],auVar27);
  auVar28 = vpaddd_avx2(auVar28,auVar18);
  auVar28 = vpaddd_avx2(auVar28,auVar30);
  auVar30 = vpmulld_avx2((undefined1  [32])in[3],auVar27);
  auVar20 = vpmulld_avx2(auVar20,(undefined1  [32])in[4]);
  auVar30 = vpaddd_avx2(auVar30,auVar18);
  auVar35 = vpsubd_avx2(auVar30,auVar20);
  auVar30 = vpmulld_avx2((undefined1  [32])in[1],auVar26);
  auVar20 = vpmulld_avx2((undefined1  [32])in[6],auVar23);
  auVar30 = vpaddd_avx2(auVar30,auVar18);
  auVar30 = vpaddd_avx2(auVar20,auVar30);
  auVar21._4_4_ = iVar14;
  auVar21._0_4_ = iVar14;
  auVar21._8_4_ = iVar14;
  auVar21._12_4_ = iVar14;
  auVar21._16_4_ = iVar14;
  auVar21._20_4_ = iVar14;
  auVar21._24_4_ = iVar14;
  auVar21._28_4_ = iVar14;
  auVar20 = vpmulld_avx2((undefined1  [32])in[1],auVar23);
  auVar23 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar27 = vpsrad_avx2(auVar29,ZEXT416((uint)bit));
  auVar17 = ZEXT416((uint)bit);
  auVar32 = vpsrad_avx2(auVar4,auVar17);
  auVar34 = vpsrad_avx2(auVar34,auVar17);
  auVar28 = vpsrad_avx2(auVar28,auVar17);
  auVar35 = vpsrad_avx2(auVar35,auVar17);
  auVar24._4_4_ = iVar12;
  auVar24._0_4_ = iVar12;
  auVar24._8_4_ = iVar12;
  auVar24._12_4_ = iVar12;
  auVar24._16_4_ = iVar12;
  auVar24._20_4_ = iVar12;
  auVar24._24_4_ = iVar12;
  auVar24._28_4_ = iVar12;
  auVar17 = ZEXT416((uint)bit);
  auVar30 = vpsrad_avx2(auVar30,auVar17);
  auVar4 = vpmulld_avx2(auVar26,(undefined1  [32])in[6]);
  auVar3 = vpaddd_avx2(auVar20,auVar18);
  auVar3 = vpsubd_avx2(auVar3,auVar4);
  auVar20 = vpsrad_avx2(auVar3,auVar17);
  auVar3 = vpaddd_avx2(auVar28,auVar23);
  auVar4 = vpsubd_avx2(auVar23,auVar28);
  auVar4 = vpmaxsd_avx2(auVar4,auVar21);
  auVar29 = vpminsd_avx2(auVar4,auVar24);
  auVar4 = vpaddd_avx2(auVar35,auVar27);
  auVar28 = vpsubd_avx2(auVar27,auVar35);
  auVar28 = vpmaxsd_avx2(auVar28,auVar21);
  auVar27 = vpminsd_avx2(auVar28,auVar24);
  auVar28 = vpaddd_avx2(auVar30,auVar32);
  auVar32 = vpsubd_avx2(auVar32,auVar30);
  auVar30 = vpaddd_avx2(auVar20,auVar34);
  auVar34 = vpsubd_avx2(auVar34,auVar20);
  auVar20 = vpmulld_avx2(auVar29,auVar19);
  auVar23 = vpmulld_avx2(auVar27,auVar25);
  auVar20 = vpaddd_avx2(auVar20,auVar18);
  auVar20 = vpaddd_avx2(auVar20,auVar23);
  auVar36._4_4_ = iVar16;
  auVar36._0_4_ = iVar16;
  auVar36._8_4_ = iVar16;
  auVar36._12_4_ = iVar16;
  auVar36._16_4_ = iVar16;
  auVar36._20_4_ = iVar16;
  auVar36._24_4_ = iVar16;
  auVar36._28_4_ = iVar16;
  auVar23 = vpmaxsd_avx2(auVar32,auVar21);
  auVar32 = vpminsd_avx2(auVar23,auVar24);
  auVar23 = vpmaxsd_avx2(auVar34,auVar21);
  auVar34 = vpminsd_avx2(auVar23,auVar24);
  auVar23 = vpmulld_avx2(auVar29,auVar25);
  auVar29 = vpmulld_avx2(auVar19,auVar27);
  auVar23 = vpaddd_avx2(auVar23,auVar18);
  auVar35 = vpsubd_avx2(auVar23,auVar29);
  auVar23 = vpmulld_avx2(auVar32,auVar36);
  auVar29 = vpmulld_avx2(auVar34,auVar19);
  auVar23 = vpaddd_avx2(auVar23,auVar18);
  auVar23 = vpaddd_avx2(auVar23,auVar29);
  auVar32 = vpmulld_avx2(auVar32,auVar19);
  auVar34 = vpmulld_avx2(auVar36,auVar34);
  auVar3 = vpmaxsd_avx2(auVar3,auVar21);
  auVar29 = vpminsd_avx2(auVar3,auVar24);
  auVar3 = vpmaxsd_avx2(auVar4,auVar21);
  auVar27 = vpminsd_avx2(auVar3,auVar24);
  auVar3 = vpmaxsd_avx2(auVar28,auVar21);
  auVar4 = vpminsd_avx2(auVar3,auVar24);
  auVar3 = vpmaxsd_avx2(auVar30,auVar21);
  auVar28 = vpminsd_avx2(auVar3,auVar24);
  auVar30 = vpsrad_avx2(auVar20,auVar17);
  auVar20 = vpsrad_avx2(auVar35,auVar17);
  auVar23 = vpsrad_avx2(auVar23,auVar17);
  auVar3 = vpaddd_avx2(auVar32,auVar18);
  auVar3 = vpsubd_avx2(auVar3,auVar34);
  auVar32 = vpsrad_avx2(auVar3,auVar17);
  auVar3 = vpaddd_avx2(auVar4,auVar29);
  auVar29 = vpsubd_avx2(auVar29,auVar4);
  auVar4 = vpaddd_avx2(auVar28,auVar27);
  auVar27 = vpsubd_avx2(auVar27,auVar28);
  auVar28 = vpaddd_avx2(auVar23,auVar30);
  auVar34 = vpsubd_avx2(auVar30,auVar23);
  auVar30 = vpaddd_avx2(auVar32,auVar20);
  auVar32 = vpsubd_avx2(auVar20,auVar32);
  auVar3 = vpmaxsd_avx2(auVar3,auVar21);
  auVar20 = vpmaxsd_avx2(auVar29,auVar21);
  auVar4 = vpmaxsd_avx2(auVar4,auVar21);
  auVar23 = vpmaxsd_avx2(auVar27,auVar21);
  auVar28 = vpmaxsd_avx2(auVar28,auVar21);
  auVar29 = vpmaxsd_avx2(auVar34,auVar21);
  auVar30 = vpmaxsd_avx2(auVar30,auVar21);
  auVar27 = vpmaxsd_avx2(auVar32,auVar21);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar13 + 0x1e0);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  alVar22 = (__m256i)vpminsd_avx2(auVar3,auVar24);
  auVar3 = vpminsd_avx2(auVar20,auVar24);
  auVar20 = vpminsd_avx2(auVar4,auVar24);
  auVar4 = vpminsd_avx2(auVar23,auVar24);
  auVar23 = vpminsd_avx2(auVar28,auVar24);
  auVar28 = vpminsd_avx2(auVar29,auVar24);
  alVar2 = (__m256i)vpminsd_avx2(auVar30,auVar24);
  auVar30 = vpminsd_avx2(auVar27,auVar24);
  auVar3 = vpmulld_avx2(auVar3,auVar35);
  auVar29 = vpmulld_avx2(auVar4,auVar35);
  auVar3 = vpaddd_avx2(auVar3,auVar18);
  auVar4 = vpaddd_avx2(auVar3,auVar29);
  auVar29 = vpsubd_avx2(auVar3,auVar29);
  auVar3 = vpmulld_avx2(auVar28,auVar35);
  auVar30 = vpmulld_avx2(auVar30,auVar35);
  auVar3 = vpaddd_avx2(auVar3,auVar18);
  auVar28 = vpaddd_avx2(auVar3,auVar30);
  auVar30 = vpsubd_avx2(auVar3,auVar30);
  auVar3 = vpsrad_avx2(auVar4,auVar17);
  alVar5 = (__m256i)vpsrad_avx2(auVar29,auVar17);
  alVar6 = (__m256i)vpsrad_avx2(auVar28,ZEXT416((uint)bit));
  auVar4 = vpsrad_avx2(auVar30,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar11 = 10;
    if (10 < bd) {
      iVar11 = bd;
    }
    iVar11 = 0x20 << ((byte)iVar11 & 0x1f);
    iVar12 = -iVar11;
    auVar29._4_4_ = iVar12;
    auVar29._0_4_ = iVar12;
    auVar29._8_4_ = iVar12;
    auVar29._12_4_ = iVar12;
    auVar29._16_4_ = iVar12;
    auVar29._20_4_ = iVar12;
    auVar29._24_4_ = iVar12;
    auVar29._28_4_ = iVar12;
    iVar11 = iVar11 + -1;
    auVar31._4_4_ = iVar11;
    auVar31._0_4_ = iVar11;
    auVar31._8_4_ = iVar11;
    auVar31._12_4_ = iVar11;
    auVar31._16_4_ = iVar11;
    auVar31._20_4_ = iVar11;
    auVar31._24_4_ = iVar11;
    auVar31._28_4_ = iVar11;
    iVar11 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar33._4_4_ = iVar11;
    auVar33._0_4_ = iVar11;
    auVar33._8_4_ = iVar11;
    auVar33._12_4_ = iVar11;
    auVar33._16_4_ = iVar11;
    auVar33._20_4_ = iVar11;
    auVar33._24_4_ = iVar11;
    auVar33._28_4_ = iVar11;
    auVar28 = vpaddd_avx2(auVar33,(undefined1  [32])alVar22);
    auVar30 = vpsubd_avx2(auVar33,auVar23);
    auVar28 = vpsrad_avx2(auVar28,ZEXT416((uint)out_shift));
    auVar30 = vpsrad_avx2(auVar30,ZEXT416((uint)out_shift));
    auVar28 = vpmaxsd_avx2(auVar28,auVar29);
    alVar22 = (__m256i)vpminsd_avx2(auVar28,auVar31);
    auVar28 = vpmaxsd_avx2(auVar30,auVar29);
    alVar7 = (__m256i)vpminsd_avx2(auVar28,auVar31);
    auVar28 = vpaddd_avx2(auVar33,(undefined1  [32])alVar6);
    auVar30 = vpsubd_avx2(auVar33,auVar3);
    auVar17 = ZEXT416((uint)out_shift);
    auVar3 = vpsrad_avx2(auVar28,auVar17);
    auVar28 = vpsrad_avx2(auVar30,auVar17);
    auVar3 = vpmaxsd_avx2(auVar3,auVar29);
    alVar6 = (__m256i)vpminsd_avx2(auVar3,auVar31);
    auVar3 = vpmaxsd_avx2(auVar28,auVar29);
    alVar8 = (__m256i)vpminsd_avx2(auVar3,auVar31);
    auVar3 = vpaddd_avx2(auVar33,(undefined1  [32])alVar5);
    auVar4 = vpsubd_avx2(auVar33,auVar4);
    auVar3 = vpsrad_avx2(auVar3,auVar17);
    auVar4 = vpsrad_avx2(auVar4,auVar17);
    auVar3 = vpmaxsd_avx2(auVar3,auVar29);
    alVar5 = (__m256i)vpminsd_avx2(auVar3,auVar31);
    auVar3 = vpmaxsd_avx2(auVar4,auVar29);
    alVar9 = (__m256i)vpminsd_avx2(auVar3,auVar31);
    auVar3 = vpaddd_avx2(auVar33,(undefined1  [32])alVar2);
    auVar4 = vpsubd_avx2(auVar33,auVar20);
    auVar3 = vpsrad_avx2(auVar3,ZEXT416((uint)out_shift));
    auVar4 = vpsrad_avx2(auVar4,ZEXT416((uint)out_shift));
    auVar3 = vpmaxsd_avx2(auVar3,auVar29);
    alVar2 = (__m256i)vpminsd_avx2(auVar3,auVar31);
    auVar3 = vpmaxsd_avx2(auVar4,auVar29);
    alVar10 = (__m256i)vpminsd_avx2(auVar3,auVar31);
  }
  else {
    auVar28 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar7 = (__m256i)vpsubd_avx2(auVar28,auVar23);
    alVar8 = (__m256i)vpsubd_avx2(auVar28,auVar3);
    alVar9 = (__m256i)vpsubd_avx2(auVar28,auVar4);
    alVar10 = (__m256i)vpsubd_avx2(auVar28,auVar20);
  }
  *out = alVar22;
  out[1] = alVar7;
  out[2] = alVar6;
  out[3] = alVar8;
  out[4] = alVar5;
  out[5] = alVar9;
  out[6] = alVar2;
  out[7] = alVar10;
  return;
}

Assistant:

static void iadst8x8_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                          int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i u[8], v[8], x;

  // stage 0
  // stage 1
  // stage 2

  u[0] = _mm256_mullo_epi32(in[7], cospi4);
  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(u[0], x);
  u[0] = _mm256_add_epi32(u[0], rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  u[1] = _mm256_mullo_epi32(in[7], cospi60);
  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(u[1], x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  u[2] = _mm256_mullo_epi32(in[5], cospi20);
  x = _mm256_mullo_epi32(in[2], cospi44);
  u[2] = _mm256_add_epi32(u[2], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_mullo_epi32(in[5], cospi44);
  x = _mm256_mullo_epi32(in[2], cospi20);
  u[3] = _mm256_sub_epi32(u[3], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  u[4] = _mm256_mullo_epi32(in[3], cospi36);
  x = _mm256_mullo_epi32(in[4], cospi28);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(in[3], cospi28);
  x = _mm256_mullo_epi32(in[4], cospi36);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(in[1], cospi52);
  x = _mm256_mullo_epi32(in[6], cospi12);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(in[1], cospi12);
  x = _mm256_mullo_epi32(in[6], cospi52);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 3
  addsub_avx2(u[0], u[4], &v[0], &v[4], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[5], &v[1], &v[5], &clamp_lo, &clamp_hi);
  addsub_avx2(u[2], u[6], &v[2], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[3], u[7], &v[3], &v[7], &clamp_lo, &clamp_hi);

  // stage 4
  u[0] = v[0];
  u[1] = v[1];
  u[2] = v[2];
  u[3] = v[3];

  u[4] = _mm256_mullo_epi32(v[4], cospi16);
  x = _mm256_mullo_epi32(v[5], cospi48);
  u[4] = _mm256_add_epi32(u[4], x);
  u[4] = _mm256_add_epi32(u[4], rnding);
  u[4] = _mm256_srai_epi32(u[4], bit);

  u[5] = _mm256_mullo_epi32(v[4], cospi48);
  x = _mm256_mullo_epi32(v[5], cospi16);
  u[5] = _mm256_sub_epi32(u[5], x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  u[6] = _mm256_mullo_epi32(v[6], cospim48);
  x = _mm256_mullo_epi32(v[7], cospi16);
  u[6] = _mm256_add_epi32(u[6], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_mullo_epi32(v[6], cospi16);
  x = _mm256_mullo_epi32(v[7], cospim48);
  u[7] = _mm256_sub_epi32(u[7], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 5
  addsub_avx2(u[0], u[2], &v[0], &v[2], &clamp_lo, &clamp_hi);
  addsub_avx2(u[1], u[3], &v[1], &v[3], &clamp_lo, &clamp_hi);
  addsub_avx2(u[4], u[6], &v[4], &v[6], &clamp_lo, &clamp_hi);
  addsub_avx2(u[5], u[7], &v[5], &v[7], &clamp_lo, &clamp_hi);

  // stage 6
  u[0] = v[0];
  u[1] = v[1];
  u[4] = v[4];
  u[5] = v[5];

  v[0] = _mm256_mullo_epi32(v[2], cospi32);
  x = _mm256_mullo_epi32(v[3], cospi32);
  u[2] = _mm256_add_epi32(v[0], x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(v[0], x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  v[0] = _mm256_mullo_epi32(v[6], cospi32);
  x = _mm256_mullo_epi32(v[7], cospi32);
  u[6] = _mm256_add_epi32(v[0], x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(v[0], x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}